

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O0

int __thiscall IndexTree::rotateTwice(IndexTree *this,int32_t *root,int direction)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  short local_88;
  Node *_new_right;
  Node *_new_left;
  Node *new_root;
  Node *_new_root_1;
  Node *_new_root;
  Node *_old_left;
  int32_t old_left;
  Node *_old_right;
  int32_t old_right;
  Node *_old_root;
  int32_t old_root;
  int direction_local;
  int32_t *root_local;
  IndexTree *this_local;
  
  iVar2 = *root;
  pNVar6 = this->nodes;
  iVar3 = *root;
  iVar4 = pNVar6[iVar3].right;
  pNVar7 = this->nodes;
  iVar5 = pNVar6[iVar3].left;
  pNVar8 = this->nodes;
  if (direction == -1) {
    *root = pNVar8[iVar5].right;
    pNVar7 = this->nodes;
    iVar4 = *root;
    pNVar6[iVar3].left = pNVar7[iVar4].right;
    pNVar8[iVar5].right = pNVar7[iVar4].left;
    pNVar7[iVar4].left = iVar5;
    pNVar7[iVar4].right = iVar2;
  }
  else if (direction == 1) {
    *root = pNVar7[iVar4].left;
    pNVar8 = this->nodes;
    iVar5 = *root;
    pNVar6[iVar3].right = pNVar8[iVar5].left;
    pNVar7[iVar4].left = pNVar8[iVar5].right;
    pNVar8[iVar5].right = iVar4;
    pNVar8[iVar5].left = iVar2;
  }
  pNVar6 = this->nodes;
  iVar3 = *root;
  pNVar7 = this->nodes;
  iVar4 = pNVar6[iVar3].right;
  sVar1 = pNVar6[iVar3].balance_factor;
  if (sVar1 < 1) {
    sVar1 = 0;
  }
  this->nodes[pNVar6[iVar3].left].balance_factor = -sVar1;
  local_88 = pNVar6[iVar3].balance_factor;
  if (-1 < local_88) {
    local_88 = 0;
  }
  pNVar7[iVar4].balance_factor = -local_88;
  pNVar6[iVar3].balance_factor = 0;
  return 1;
}

Assistant:

int IndexTree::rotateTwice(int32_t &root, int direction) {
    auto old_root = root;
    auto &_old_root = nodes[root];
    auto old_right = _old_root.right;
    auto &_old_right = nodes[old_right];
    auto old_left = _old_root.left;
    auto &_old_left = nodes[old_left];

//    printf("Before rotate twice %d root: %d %d %d\n", direction, root, _old_root.left, _old_root.right);
//    if (_old_root.left != -1) {
//        printf("\tleft: %d %d %d\n", _old_root.left, _old_left.left, _old_left.right);
//    }
//    if (_old_root.right != -1) {
//        printf("\tright: %d %d %d\n", _old_root.right, _old_right.left, _old_right.right);
//    }
    if (direction == -1) {
        root = _old_left.right;
        auto &_new_root = nodes[root];
        // re-attach
        _old_root.left = _new_root.right;
        _old_left.right = _new_root.left;
        _new_root.left = old_left;
        _new_root.right = old_root;
    } else if (direction == 1){
        root = _old_right.left;
        auto &_new_root = nodes[root];
        // re-attach
        _old_root.right = _new_root.left;
        _old_right.left = _new_root.right;
        _new_root.right = old_right;
        _new_root.left = old_root;
    }

    auto &new_root = nodes[root];
    auto &_new_left = nodes[new_root.left];
    auto &_new_right = nodes[new_root.right];
    _new_left.balance_factor = (int16_t) -max(new_root.balance_factor, 0);
    _new_right.balance_factor = (int16_t) -min(new_root.balance_factor, 0);
    new_root.balance_factor = 0;
//
//    printf("After rotate twice: %d %d %d\n", root, new_root.left, new_root.right);
//    if (new_root.left != -1) {
//        printf("\tleft: %d %d %d\n", new_root.left, _new_left.left, _new_left.right);
//    }
//    if (new_root.right != -1) {
//        printf("\tright: %d %d %d\n", new_root.right, _new_right.left, _new_right.right);
//    }
    return 1;
}